

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

SListLeaf *
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListLeaf::assimilate
          (Leaf *orig)

{
  SListLeaf *this;
  LDIterator local_20;
  
  this = (SListLeaf *)operator_new(0x20);
  SListLeaf(this,(TermList)(orig->super_Node)._term._content);
  (*(orig->super_Node)._vptr_Node[8])(&local_20,orig);
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Leaf::loadChildren
            ((Leaf *)this,&local_20);
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::~VirtualIterator(&local_20)
  ;
  (*(orig->super_Node)._vptr_Node[6])(orig);
  (*(orig->super_Node)._vptr_Node[1])(orig);
  return this;
}

Assistant:

typename SubstitutionTree<LeafData_>::SListLeaf* SubstitutionTree<LeafData_>::SListLeaf::assimilate(Leaf* orig)
{
  SListLeaf* res=new SListLeaf(orig->term());
  res->loadChildren(orig->allChildren());
  orig->makeEmpty();
  delete orig;
  return res;
}